

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O0

char * fl_find_fontsize(char *name)

{
  int iVar1;
  char *pcVar2;
  char *local_28;
  char *r;
  char *c;
  char *name_local;
  
  if (*name == '-') {
    pcVar2 = fl_font_word(name,7);
    name_local = pcVar2 + 1;
    if ((*pcVar2 == '\0') || (iVar1 = isdigit((int)*name_local), iVar1 == 0)) {
      name_local = (char *)0x0;
    }
  }
  else {
    local_28 = (char *)0x0;
    for (r = name + 1; *r != '\0'; r = r + 1) {
      iVar1 = isdigit((int)*r);
      if ((iVar1 != 0) && (iVar1 = isdigit((int)r[-1]), iVar1 == 0)) {
        local_28 = r;
      }
    }
    name_local = local_28;
  }
  return name_local;
}

Assistant:

char* fl_find_fontsize(char* name) {
  char* c = name;
  // for standard x font names, try after 7th dash:
  if (*c == '-') {
    c = (char*)fl_font_word(c,7);
    if (*c++ && isdigit(*c)) return c;
    return 0; // malformed x font name?
  }
  char* r = 0;
  // find last set of digits:
  for (c++;* c; c++)
    if (isdigit(*c) && !isdigit(*(c-1))) r = c;
  return r;
}